

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O0

MatrixProperties * parseSparseMatrix(string *path,int resolution,string *chrom)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  ostream *poVar4;
  void *pvVar5;
  long *plVar6;
  ostream *__args_1;
  ostream *__args_2;
  ostream *this;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  string *in_RCX;
  int in_EDX;
  string *in_RSI;
  MatrixProperties *in_RDI;
  size_t j_1;
  size_t i_1;
  int m;
  double count;
  int w;
  int v;
  string line;
  ifstream file;
  int j;
  int i;
  int maxv;
  double count_1;
  int w_1;
  int v_1;
  string line_1;
  ifstream file_1;
  int n;
  int M;
  MatrixProperties *prop;
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffa48;
  undefined7 in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffa57;
  size_type in_stack_fffffffffffffa58;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffa60;
  MatrixProperties *in_stack_fffffffffffffae0;
  double local_4d8;
  int local_4d0;
  int local_4cc;
  string local_4c8 [32];
  undefined1 local_4a8 [520];
  undefined8 local_2a0;
  int local_298;
  int local_294;
  int local_27c;
  double local_278;
  int local_270;
  int local_26c;
  string local_268 [48];
  undefined1 local_238 [524];
  int local_2c;
  int local_28;
  byte local_21;
  int local_14;
  
  local_21 = 0;
  local_14 = in_EDX;
  MatrixProperties::MatrixProperties
            ((MatrixProperties *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50));
  local_28 = 0;
  std::ifstream::ifstream(local_238,in_RSI,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Couldn\'t read file: ");
    poVar4 = std::operator<<(poVar4,in_RSI);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    __assert_fail("file.good()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/COMBINE-lab[P]matryoshka/src/MatryoshkaUtil.cpp"
                  ,0x6e,"MatrixProperties parseSparseMatrix(string, int, string)");
  }
  std::__cxx11::string::string(local_268);
  local_27c = 0;
  while( true ) {
    pvVar5 = (void *)std::istream::operator>>(local_238,&local_26c);
    pvVar5 = (void *)std::istream::operator>>(pvVar5,&local_270);
    plVar6 = (long *)std::istream::operator>>(pvVar5,&local_278);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
    if (!bVar2) break;
    if (local_27c < local_26c) {
      local_27c = local_26c;
    }
    if (local_27c < local_270) {
      local_27c = local_270;
    }
    local_28 = local_28 + 1;
  }
  local_2c = local_27c / local_14 + 1;
  std::__cxx11::string::operator=((string *)&in_RDI->chrom,in_RCX);
  in_RDI->resolution = local_14;
  poVar4 = std::operator<<((ostream *)&std::cerr,"Building matrix for chromosome ");
  poVar4 = std::operator<<(poVar4,(string *)&in_RDI->chrom);
  poVar4 = std::operator<<(poVar4," at resolution ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI->resolution);
  poVar4 = std::operator<<(poVar4,"bp with ");
  __args_1 = (ostream *)std::ostream::operator<<(poVar4,local_2c);
  __args_2 = std::operator<<(__args_1," rows.");
  std::ostream::operator<<(__args_2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_268);
  std::ifstream::~ifstream(local_238);
  this = std::operator<<((ostream *)&std::cerr,"Initializing matrix to zero elements");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::
  make_shared<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,int&,int&,int&>
            ((int *)poVar4,(int *)__args_1,(int *)__args_2);
  std::
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::operator=((shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
              in_stack_fffffffffffffa48);
  std::
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::~shared_ptr((shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                 *)0x1df370);
  for (local_294 = 0; local_294 < local_2c; local_294 = local_294 + 1) {
    for (local_298 = 0; local_298 < local_2c; local_298 = local_298 + 1) {
      std::
      __shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1df3b7);
      local_2a0 = 0;
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::insert_element(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                       CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                       (const_reference)in_stack_fffffffffffffa48);
    }
  }
  std::ifstream::ifstream(local_4a8,in_RSI,_S_in);
  std::__cxx11::string::string(local_4c8);
  while( true ) {
    pvVar5 = (void *)std::istream::operator>>(local_4a8,&local_4cc);
    this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)std::istream::operator>>(pvVar5,&local_4d0);
    plVar6 = (long *)std::istream::operator>>(this_00,&local_4d8);
    uVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
    if (!(bool)uVar3) break;
    std::
    __shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1df510);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::insert_element(this_00,(size_type)plVar6,CONCAT17(uVar3,in_stack_fffffffffffffa50),
                     (const_reference)in_stack_fffffffffffffa48);
  }
  MatrixProperties::computemuBI(in_stack_fffffffffffffae0);
  local_21 = 1;
  std::__cxx11::string::~string(local_4c8);
  std::ifstream::~ifstream(local_4a8);
  if ((local_21 & 1) == 0) {
    MatrixProperties::~MatrixProperties
              ((MatrixProperties *)CONCAT17(uVar3,in_stack_fffffffffffffa50));
  }
  return in_RDI;
}

Assistant:

MatrixProperties parseSparseMatrix(string path, int resolution, string chrom) {
    MatrixProperties prop;
    int M=0;
    int n;

    {
        ifstream file(path);
        if (!file.good()) {
            std::cerr << "Couldn't read file: " << path << std::endl;
            std::exit(1);
        }
        assert(file.good());

        string line;
        int v, w;
        double count;
        int maxv = 0;
        while ( file >> v >> w >> count )  {
            if (v > maxv) maxv = v;
            if (w > maxv) maxv = w;
            M++;
        }
        n = maxv/resolution+1;
        prop.chrom = chrom;
        prop.resolution = resolution;
        cerr << "Building matrix for chromosome " << prop.chrom << " at resolution " << prop.resolution << "bp with " << n << " rows." << endl;
    }

    cerr << "Initializing matrix to zero elements" << endl;
    prop.matrix = std::make_shared<SparseMatrix>(n,n,M);

    for (auto i = 0; i < n; i++) {
        for (auto j = 0; j < n; j++) {
            prop.matrix->insert_element(i,j, 0.0);
        }
    }
    
    ifstream file(path);
    string line;
    int v, w;
    double count;
    int m = 0;
    while ( file >> v >> w >> count )  {
        size_t i = v/resolution;
        size_t j = w/resolution;
        //prop.matrix->insert_element(i, j, log(count));
        prop.matrix->insert_element(i, j, count);
        m++;
        //if ( m % 100000 == 0 ) { std::cerr << "" << float(m)/M*100 << "%\n"; }
    }

    prop.computemuBI();
    return prop;
}